

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::ZeroCopyCodedInputStream::ReadCord
          (ZeroCopyCodedInputStream *this,Cord *cord,int count)

{
  bool bVar1;
  Cord tmp;
  anon_union_16_2_39e9c77e_for_Rep_0 local_28;
  
  bVar1 = absl::lts_20250127::Cord::empty(cord);
  if (bVar1) {
    bVar1 = io::CodedInputStream::ReadCord(this->cis_,cord,count);
    return bVar1;
  }
  local_28.as_tree.cordz_info = 0;
  local_28.as_tree.rep = (CordRep *)0x0;
  bVar1 = io::CodedInputStream::ReadCord(this->cis_,(Cord *)&local_28.as_tree,count);
  absl::lts_20250127::Cord::Append(cord,(Cord *)&local_28.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_28.as_tree);
  return bVar1;
}

Assistant:

bool ReadCord(absl::Cord* cord, int count) final {
    // Fast path: tail call into ReadCord reading new value.
    if (ABSL_PREDICT_TRUE(cord->empty())) {
      return cis_->ReadCord(cord, count);
    }
    absl::Cord tmp;
    bool res = cis_->ReadCord(&tmp, count);
    cord->Append(std::move(tmp));
    return res;
  }